

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

wchar_t rd_history(void)

{
  bool bVar1;
  wchar_t wVar2;
  char *pcVar3;
  artifact *paVar4;
  ulong uVar5;
  ulong uVar6;
  int16_t clev;
  int16_t dlev;
  bitflag type [2];
  int32_t turnno;
  uint32_t tmp32u;
  char name [80];
  char text [80];
  short local_e6;
  short local_e4;
  bitflag local_e2 [2];
  wchar_t local_e0;
  uint local_dc;
  char local_d8 [80];
  char local_88 [88];
  
  history_clear(player);
  rd_byte(&hist_size);
  if (hist_size < 3) {
    rd_u32b(&local_dc);
    if (local_dc != 0) {
      uVar5 = 0;
      do {
        if (hist_size != '\0') {
          uVar6 = 0;
          do {
            rd_byte(local_e2 + uVar6);
            uVar6 = uVar6 + 1;
          } while (uVar6 < hist_size);
        }
        rd_s32b(&local_e0);
        rd_s16b(&local_e4);
        rd_s16b(&local_e6);
        rd_string(local_d8,0x50);
        if (local_d8[0] == '\0') {
LAB_0016407b:
          bVar1 = false;
          wVar2 = L'\0';
        }
        else {
          paVar4 = lookup_artifact_name(local_d8);
          if (paVar4 == (artifact *)0x0) goto LAB_0016407b;
          wVar2 = paVar4->aidx;
          bVar1 = true;
        }
        rd_string(local_88,0x50);
        if ((bVar1) || (local_d8[0] == '\0')) {
          history_add_full(player,local_e2,wVar2,(int)local_e4,(int)local_e6,local_e0,local_88);
        }
        else {
          pcVar3 = format("Couldn\'t find artifact %s!",local_d8);
          note(pcVar3);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < local_dc);
    }
    wVar2 = L'\0';
  }
  else {
    pcVar3 = format("Too many (%u) history types!");
    note(pcVar3);
    wVar2 = L'\xffffffff';
  }
  return wVar2;
}

Assistant:

int rd_history(void)
{
	uint32_t tmp32u;
	size_t i, j;
	
	history_clear(player);

	/* History type flags */
	rd_byte(&hist_size);
	if (hist_size > HIST_SIZE) {
	        note(format("Too many (%u) history types!", hist_size));
		return (-1);
	}

	rd_u32b(&tmp32u);
	for (i = 0; i < tmp32u; i++) {
		int32_t turnno;
		int16_t dlev, clev;
		bitflag type[HIST_SIZE];
		const struct artifact *art = NULL;
		int aidx = 0;
		char name[80];
		char text[80];

		for (j = 0; j < hist_size; j++)		
			rd_byte(&type[j]);
		rd_s32b(&turnno);
		rd_s16b(&dlev);
		rd_s16b(&clev);
		rd_string(name, sizeof(name));
		if (name[0]) {
			art = lookup_artifact_name(name);
			if (art) {
				aidx = art->aidx;
			}
		}
		rd_string(text, sizeof(text));
		if (name[0] && !art) {
			note(format("Couldn't find artifact %s!", name));
			continue;
		}

		history_add_full(player, type, aidx, dlev, clev, turnno, text);
	}

	return 0;
}